

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_literal_string_abi_cxx11_
          (result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  const_iterator rollback;
  value_type *pvVar3;
  ptrdiff_t pVar4;
  internal_error *piVar5;
  syntax_error *this_00;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  long lVar6;
  long lVar7;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  location inner_loc;
  result<toml::detail::region,_toml::detail::none_t> body;
  result<toml::detail::region,_toml::detail::none_t> close;
  result<toml::detail::region,_toml::detail::none_t> open;
  result<toml::detail::region,_toml::detail::none_t> token;
  allocator_type local_369;
  string local_368;
  undefined1 local_348 [40];
  undefined1 local_320 [16];
  undefined1 local_310 [8];
  undefined1 local_308 [56];
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d0;
  location local_2b8;
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [4];
  undefined1 local_218 [80];
  undefined1 local_1c8 [80];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  undefined1 local_150 [72];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  pair<toml::string,_toml::detail::region> local_e8;
  result<toml::detail::region,_toml::detail::none_t> local_78;
  
  rollback._M_current = *(char **)(this + 0x40);
  sequence<toml::detail::character<'\''>,_toml::detail::repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'\x7f'>,_toml::detail::character<'\''>_>_>,_toml::detail::unlimited>,_toml::detail::character<'\''>_>
  ::invoke(&local_78,(location *)this);
  if (local_78.is_ok_ == true) {
    location::location(&local_2b8,(location *)this);
    location::reset(&local_2b8,rollback);
    character<'\''>::invoke
              ((result<toml::detail::region,_toml::detail::none_t> *)&local_158,&local_2b8);
    if (local_158._0_1_ == false) {
      piVar5 = (internal_error *)__cxa_allocate_exception(0x78);
      local_320._0_8_ = local_310;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_320,"parse_literal_string: invalid token","");
      source_location::source_location((source_location *)&local_e8,&local_2b8);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[12],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1c8,(source_location *)&local_e8,(char (*) [12])"should be \'");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_1c8;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_368,__l_00,(allocator_type *)&local_2d0);
      local_348._0_8_ = (pointer)0x0;
      local_348._8_8_ = (pointer)0x0;
      local_348._16_8_ = (pointer)0x0;
      format_underline((string *)local_218,(string *)local_320,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_368,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_348,false);
      source_location::source_location((source_location *)local_268,&local_2b8);
      internal_error::internal_error(piVar5,(string *)local_218,(source_location *)local_268);
      __cxa_throw(piVar5,&internal_error::typeinfo,internal_error::~internal_error);
    }
    repeat<toml::detail::exclude<toml::detail::either<toml::detail::in_range<'\x00',_'\b'>,_toml::detail::in_range<'\n',_'\x1f'>,_toml::detail::character<'\x7f'>,_toml::detail::character<'\''>_>_>,_toml::detail::unlimited>
    ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_268,&local_2b8);
    character<'\''>::invoke
              ((result<toml::detail::region,_toml::detail::none_t> *)local_218,&local_2b8);
    if (local_218[0] == (string)0x0) {
      piVar5 = (internal_error *)__cxa_allocate_exception(0x78);
      local_348._0_8_ = local_348 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_348,"parse_literal_string: invalid token","");
      source_location::source_location((source_location *)&local_e8,&local_2b8);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[12],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1c8,(source_location *)&local_e8,(char (*) [12])"should be \'");
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_1c8;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_2d0,__l_01,&local_369);
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline(&local_368,(string *)local_348,&local_2d0,&local_108,false);
      source_location::source_location((source_location *)local_320,&local_2b8);
      internal_error::internal_error(piVar5,&local_368,(source_location *)local_320);
      __cxa_throw(piVar5,&internal_error::typeinfo,internal_error::~internal_error);
    }
    pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_78);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((string *)local_1c8,(detail *)(pvVar3->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar3->last_)._M_current,in_RCX);
    pVar4 = check_utf8_validity((string *)local_1c8);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    if (pVar4 != -1) {
      location::reset(&local_2b8,rollback);
      if (pVar4 == 0) {
        lVar6 = 0;
      }
      else {
        lVar7 = 0;
        lVar6 = 0;
        do {
          lVar6 = lVar6 + (ulong)(local_2b8.iter_._M_current[lVar7] == '\n');
          lVar7 = lVar7 + 1;
        } while (pVar4 != lVar7);
      }
      local_2b8.line_number_ = local_2b8.line_number_ + lVar6;
      local_2b8.iter_._M_current = local_2b8.iter_._M_current + pVar4;
      this_00 = (syntax_error *)__cxa_allocate_exception(0x78);
      local_348._0_8_ = local_348 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_348,"parse_literal_string: invalid utf8 sequence found","");
      source_location::source_location((source_location *)&local_e8,&local_2b8);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[5],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1c8,(source_location *)&local_e8,(char (*) [5])0x18a351);
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)local_1c8;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_2d0,__l_02,&local_369);
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline(&local_368,(string *)local_348,&local_2d0,&local_108,false);
      source_location::source_location((source_location *)local_320,&local_2b8);
      syntax_error::syntax_error(this_00,&local_368,(source_location *)local_320);
      __cxa_throw(this_00,&syntax_error::typeinfo,syntax_error::~syntax_error);
    }
    pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                       ((result<toml::detail::region,_toml::detail::none_t> *)local_268);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (&local_368,(detail *)(pvVar3->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar3->last_)._M_current,in_RCX);
    local_320[0] = 1;
    paVar2 = &local_368.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p == paVar2) {
      local_308._8_8_ = local_368.field_2._8_8_;
      local_320._8_8_ = (pointer)local_308;
    }
    else {
      local_320._8_8_ = local_368._M_dataplus._M_p;
    }
    local_308._1_7_ = local_368.field_2._M_allocated_capacity._1_7_;
    local_308[0] = local_368.field_2._M_local_buf[0];
    local_310 = (undefined1  [8])local_368._M_string_length;
    local_368._M_string_length = 0;
    local_368.field_2._M_local_buf[0] = '\0';
    local_368._M_dataplus._M_p = (pointer)paVar2;
    pvVar3 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_78);
    std::pair<toml::string,_toml::detail::region>::pair<toml::string,_true>
              (&local_e8,(string *)local_320,pvVar3);
    std::pair<toml::string,_toml::detail::region>::pair
              ((pair<toml::string,_toml::detail::region> *)local_1c8,&local_e8);
    __return_storage_ptr__->is_ok_ = true;
    std::pair<toml::string,_toml::detail::region>::pair
              (&(__return_storage_ptr__->field_1).succ.value,
               (pair<toml::string,_toml::detail::region> *)local_1c8);
    success<std::pair<toml::string,_toml::detail::region>_>::~success
              ((success<std::pair<toml::string,_toml::detail::region>_> *)local_1c8);
    region::~region(&local_e8.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.first.str._M_dataplus._M_p != &local_e8.first.str.field_2) {
      operator_delete(local_e8.first.str._M_dataplus._M_p,
                      local_e8.first.str.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_320._8_8_ != (pointer)local_308) {
      operator_delete((void *)local_320._8_8_,local_308._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar2) {
      operator_delete(local_368._M_dataplus._M_p,
                      CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                               local_368.field_2._M_local_buf[0]) + 1);
    }
    if (local_218[0] == (string)0x1) {
      region::~region((region *)(local_218 + 8));
    }
    if (local_268[0] == true) {
      region::~region((region *)(local_268 + 8));
    }
    if (local_158._0_1_ == true) {
      region::~region((region *)local_150);
    }
    location::~location(&local_2b8);
  }
  else {
    location::reset((location *)this,rollback);
    local_218._0_8_ = local_218 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_218,
               "toml::parse_literal_string: the next token is not a valid literal string","");
    source_location::source_location((source_location *)&local_e8,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[5],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1c8,(source_location *)&local_e8,(char (*) [5])0x18a351);
    __l._M_len = 1;
    __l._M_array = (iterator)local_1c8;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_320,__l,(allocator_type *)&local_368);
    local_2b8.super_region_base._vptr_region_base = (_func_int **)0x0;
    local_2b8.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_2b8.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    format_underline((string *)local_268,(string *)local_218,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_320,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2b8,false);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_150 + 8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._0_8_ == local_258) {
      local_150._16_8_ = local_258[0]._8_8_;
      local_158 = paVar2;
    }
    else {
      local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._0_8_;
    }
    local_150._9_7_ = local_258[0]._M_allocated_capacity._1_7_;
    local_150[8] = local_258[0]._M_local_buf[0];
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if (local_158 == paVar2) {
      paVar1->_M_allocated_capacity = local_150._8_8_;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8))->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._16_8_;
    }
    else {
      (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p = (pointer)local_158;
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity = local_150._8_8_;
    }
    (__return_storage_ptr__->field_1).fail.value._M_string_length = local_268._8_8_;
    local_150._8_8_ = (ulong)(uint7)local_258[0]._1_7_ << 8;
    local_150._0_8_ = (_func_int **)0x0;
    local_258[0]._M_local_buf[0] = '\0';
    local_268._8_8_ = (_func_int **)0x0;
    local_268._0_8_ = local_258;
    local_158 = paVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2b8);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_allocated_capacity != &local_168) {
      operator_delete((void *)local_178._M_allocated_capacity,local_168._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_1c8);
    source_location::~source_location((source_location *)&local_e8);
    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
      operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
    }
  }
  if (local_78.is_ok_ == true) {
    region::~region(&local_78.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<toml::string, region>, std::string>
parse_literal_string(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_literal_string::invoke(loc))
    {
        auto inner_loc = loc;
        inner_loc.reset(first);

        const auto open = lex_apostrophe::invoke(inner_loc);
        if(!open)
        {
            throw internal_error(format_underline(
                "parse_literal_string: invalid token",
                {{source_location(inner_loc), "should be '"}}),
                source_location(inner_loc));
        }

        const auto body = repeat<lex_literal_char, unlimited>::invoke(inner_loc);

        const auto close = lex_apostrophe::invoke(inner_loc);
        if(!close)
        {
            throw internal_error(format_underline(
                "parse_literal_string: invalid token",
                {{source_location(inner_loc), "should be '"}}),
                source_location(inner_loc));
        }

        const auto err_loc = check_utf8_validity(token.unwrap().str());
        if(err_loc == -1)
        {
            return ok(std::make_pair(
                      toml::string(body.unwrap().str(), toml::string_t::literal),
                      token.unwrap()));
        }
        else
        {
            inner_loc.reset(first);
            inner_loc.advance(err_loc);
            throw syntax_error(format_underline(
                "parse_literal_string: invalid utf8 sequence found",
                {{source_location(inner_loc), "here"}}),
                source_location(inner_loc));
        }
    }
    else
    {
        loc.reset(first); // rollback
        return err(format_underline("toml::parse_literal_string: "
                   "the next token is not a valid literal string",
                   {{source_location(loc), "here"}}));
    }
}